

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O0

size_t __thiscall
ProductAggregate_hash::operator()(ProductAggregate_hash *this,ProductAggregate *key)

{
  size_t sVar1;
  hash<std::bitset<1500UL>_> *in_RSI;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_00000008;
  size_t h;
  hash<bool> local_1d [2];
  hash<unsigned_long> local_1b;
  hash<unsigned_long> local_1a [2];
  ulong uVar2;
  
  uVar2 = 0;
  sVar1 = std::hash<std::bitset<1500UL>_>::operator()(in_RSI,(bitset<1500UL> *)0x0);
  uVar2 = sVar1 + 0x9e3779b9 + uVar2 * 0x40 + (uVar2 >> 2) ^ uVar2;
  sVar1 = std::hash<unsigned_long>::operator()(local_1a,*(unsigned_long *)(in_RSI + 0xd8));
  uVar2 = sVar1 + 0x9e3779b9 + uVar2 * 0x40 + (uVar2 >> 2) ^ uVar2;
  sVar1 = std::hash<unsigned_long>::operator()(&local_1b,*(unsigned_long *)(in_RSI + 0xe0));
  uVar2 = sVar1 + 0x9e3779b9 + uVar2 * 0x40 + (uVar2 >> 2) ^ uVar2;
  sVar1 = std::
          hash<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::operator()((hash<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)h,in_stack_00000008);
  uVar2 = sVar1 + 0x9e3779b9 + uVar2 * 0x40 + (uVar2 >> 2) ^ uVar2;
  sVar1 = std::hash<bool>::operator()(local_1d,(bool)((byte)in_RSI[0xf8] & 1));
  return sVar1 + 0x9e3779b9 + uVar2 * 0x40 + (uVar2 >> 2) ^ uVar2;
}

Assistant:

size_t operator()(const ProductAggregate &key ) const
    {
        size_t h = 0;
        h ^= std::hash<prod_bitset>()(key.product)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.previous.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<std::vector<std::pair<size_t,size_t>>>()(key.viewAggregate)+
            0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<bool>()(key.multiplyByCount)+0x9e3779b9 + (h<<6) + (h>>2);
        return h;
    }